

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDH.cpp
# Opt level: O1

bool __thiscall
OSSLECDH::deriveKey(OSSLECDH *this,SymmetricKey **ppSymmetricKey,PublicKey *publicKey,
                   PrivateKey *privateKey)

{
  int iVar1;
  uint uVar2;
  EC_KEY *key;
  EC_KEY *ecdh;
  EC_POINT *pEVar3;
  undefined8 uVar4;
  uchar *puVar5;
  size_t sVar6;
  uchar *__src;
  SymmetricKey *this_00;
  ulong uVar7;
  bool bVar8;
  size_t newSize;
  ByteString derivedSecret;
  ByteString secret;
  ByteString local_80;
  ByteString local_58;
  
  if (privateKey != (PrivateKey *)0x0 &&
      (publicKey != (PublicKey *)0x0 && ppSymmetricKey != (SymmetricKey **)0x0)) {
    key = OSSLECPublicKey::getOSSLKey((OSSLECPublicKey *)publicKey);
    ecdh = OSSLECPrivateKey::getOSSLKey((OSSLECPrivateKey *)privateKey);
    if (((key != (EC_KEY *)0x0) &&
        (pEVar3 = EC_KEY_get0_public_key((EC_KEY *)key), ecdh != (EC_KEY *)0x0)) &&
       (pEVar3 != (EC_POINT *)0x0)) {
      uVar4 = EC_KEY_OpenSSL();
      EC_KEY_set_method(key,uVar4);
      uVar4 = EC_KEY_OpenSSL();
      EC_KEY_set_method(ecdh,uVar4);
      ByteString::ByteString(&local_58);
      ByteString::ByteString(&local_80);
      iVar1 = (**(code **)(*(long *)publicKey + 0x30))(publicKey);
      newSize = (size_t)iVar1;
      ByteString::wipe(&local_58,newSize);
      ByteString::wipe(&local_80,newSize);
      puVar5 = ByteString::operator[](&local_80,0);
      sVar6 = ByteString::size(&local_80);
      pEVar3 = EC_KEY_get0_public_key((EC_KEY *)key);
      uVar2 = ECDH_compute_key(puVar5,sVar6,pEVar3,(EC_KEY *)ecdh,(KDF *)0x0);
      if ((int)uVar2 < 1) {
        uVar7 = ERR_get_error();
        bVar8 = false;
        softHSMLog(3,"deriveKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDH.cpp"
                   ,0xde,"ECDH key derivation failed (0x%08X)",uVar7);
      }
      else {
        puVar5 = ByteString::operator[](&local_58,0);
        __src = ByteString::operator[](&local_80,0);
        memcpy(puVar5 + (newSize - uVar2),__src,(ulong)uVar2);
        this_00 = (SymmetricKey *)operator_new(0x38);
        sVar6 = ByteString::size(&local_58);
        SymmetricKey::SymmetricKey(this_00,sVar6 << 3);
        *ppSymmetricKey = this_00;
        iVar1 = (*(this_00->super_Serialisable)._vptr_Serialisable[3])(this_00,&local_58);
        bVar8 = true;
        if ((char)iVar1 == '\0') {
          if (*ppSymmetricKey != (SymmetricKey *)0x0) {
            (*((*ppSymmetricKey)->super_Serialisable)._vptr_Serialisable[2])();
          }
          *ppSymmetricKey = (SymmetricKey *)0x0;
          bVar8 = false;
        }
      }
      local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_80.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_58.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      return bVar8;
    }
    softHSMLog(3,"deriveKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDH.cpp"
               ,0xb8,"Failed to get OpenSSL ECDH keys");
  }
  return false;
}

Assistant:

bool OSSLECDH::deriveKey(SymmetricKey **ppSymmetricKey, PublicKey* publicKey, PrivateKey* privateKey)
{
	// Check parameters
	if ((ppSymmetricKey == NULL) ||
	    (publicKey == NULL) ||
	    (privateKey == NULL))
	{
		return false;
	}

	// Get keys
	EC_KEY *pub = ((OSSLECPublicKey *)publicKey)->getOSSLKey();
	EC_KEY *priv = ((OSSLECPrivateKey *)privateKey)->getOSSLKey();
	if (pub == NULL || EC_KEY_get0_public_key(pub) == NULL || priv == NULL)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH keys");

		return false;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
	{
		ECDH_set_method(pub, FIPS_ecdh_openssl());
		ECDH_set_method(priv, FIPS_ecdh_openssl());
	}
	else
	{
		ECDH_set_method(pub, ECDH_OpenSSL());
		ECDH_set_method(priv, ECDH_OpenSSL());
	}
#else
	ECDH_set_method(pub, ECDH_OpenSSL());
	ECDH_set_method(priv, ECDH_OpenSSL());
#endif

#else
	EC_KEY_set_method(pub, EC_KEY_OpenSSL());
	EC_KEY_set_method(priv, EC_KEY_OpenSSL());
#endif

	// Derive the secret
	ByteString secret, derivedSecret;
	int size = ((OSSLECPublicKey *)publicKey)->getOrderLength();
	secret.wipe(size);
	derivedSecret.wipe(size);
	int keySize = ECDH_compute_key(&derivedSecret[0], derivedSecret.size(), EC_KEY_get0_public_key(pub), priv, NULL);

	if (keySize <= 0)
	{
		ERROR_MSG("ECDH key derivation failed (0x%08X)", ERR_get_error());

		return false;
	}

	// We compensate that OpenSSL removes leading zeros
	memcpy(&secret[0] + size - keySize, &derivedSecret[0], keySize);

	*ppSymmetricKey = new SymmetricKey(secret.size() * 8);
	if (*ppSymmetricKey == NULL)
		return false;
	if (!(*ppSymmetricKey)->setKeyBits(secret))
	{
		delete *ppSymmetricKey;
		*ppSymmetricKey = NULL;
		return false;
	}

	return true;
}